

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::ProjectionLight::Phi(ProjectionLight *this,SampledWavelengths *lambda)

{
  bool bVar1;
  float fVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  RGB *pRVar4;
  int c;
  int iVar5;
  ulong uVar6;
  Point2i p;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  Float FVar10;
  undefined1 extraout_var [56];
  undefined1 auVar11 [56];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [56];
  undefined1 auVar17 [64];
  SampledSpectrum SVar18;
  long local_b0;
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  undefined1 local_88 [16];
  SampledWavelengths *local_78;
  ulong local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  RGBSpectrum local_58;
  undefined1 auVar15 [64];
  
  TVar3 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  iVar5 = TVar3.y;
  if (iVar5 < 1) {
    auVar7 = ZEXT816(0);
  }
  else {
    auVar17 = ZEXT864(0);
    local_b0 = 0;
    local_78 = lambda;
    do {
      TVar3 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
      if (0 < TVar3.x) {
        local_70 = local_b0 << 0x20;
        uVar6 = 0;
        do {
          _local_68 = auVar17._0_16_;
          fVar9 = ((float)(int)uVar6 + 0.5) / (float)TVar3.x;
          fVar12 = ((float)(int)local_b0 + 0.5) / (float)TVar3.y;
          auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (this->screenBounds).pMax.
                                                          super_Tuple2<pbrt::Point2,_float>.x)),
                                   ZEXT416((uint)(1.0 - fVar9)),
                                   ZEXT416((uint)(this->screenBounds).pMin.
                                                 super_Tuple2<pbrt::Point2,_float>.x));
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (this->screenBounds).pMax.
                                                           super_Tuple2<pbrt::Point2,_float>.y)),
                                   ZEXT416((uint)(1.0 - fVar12)),
                                   ZEXT416((uint)(this->screenBounds).pMin.
                                                 super_Tuple2<pbrt::Point2,_float>.y));
          fVar13 = auVar8._0_4_;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (this->LightFromScreen).m.m[0][1])),
                                   auVar7,ZEXT416((uint)(this->LightFromScreen).m.m[0][0]));
          auVar14 = ZEXT816(0) << 0x40;
          auVar8 = vfmadd231ss_fma(auVar8,auVar14,ZEXT416((uint)(this->LightFromScreen).m.m[0][2]));
          fVar9 = auVar8._0_4_ + (this->LightFromScreen).m.m[0][3];
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (this->LightFromScreen).m.m[1][1])),
                                   auVar7,ZEXT416((uint)(this->LightFromScreen).m.m[1][0]));
          auVar8 = vfmadd231ss_fma(auVar8,auVar14,ZEXT416((uint)(this->LightFromScreen).m.m[1][2]));
          fVar12 = auVar8._0_4_ + (this->LightFromScreen).m.m[1][3];
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (this->LightFromScreen).m.m[2][1])),
                                   auVar7,ZEXT416((uint)(this->LightFromScreen).m.m[2][0]));
          auVar8 = vfmadd231ss_fma(auVar8,auVar14,ZEXT416((uint)(this->LightFromScreen).m.m[2][2]));
          fVar2 = auVar8._0_4_ + (this->LightFromScreen).m.m[2][3];
          auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (this->LightFromScreen).m.m[3][1])),
                                   auVar7,ZEXT416((uint)(this->LightFromScreen).m.m[3][0]));
          auVar7 = vfmadd231ss_fma(auVar7,auVar14,ZEXT416((uint)(this->LightFromScreen).m.m[3][2]));
          fVar13 = auVar7._0_4_ + (this->LightFromScreen).m.m[3][3];
          bVar1 = fVar13 == 1.0;
          auVar7 = ZEXT416((uint)bVar1 * (int)fVar9 + (uint)!bVar1 * (int)(fVar9 / fVar13));
          auVar17 = ZEXT1664(auVar7);
          fVar12 = (float)((uint)bVar1 * (int)fVar12 + (uint)!bVar1 * (int)(fVar12 / fVar13));
          fVar9 = (float)((uint)bVar1 * (int)fVar2 + (uint)!bVar1 * (int)(fVar2 / fVar13));
          auVar8 = ZEXT416((uint)fVar9);
          auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar7,auVar7);
          auVar7 = vfmadd231ss_fma(auVar7,auVar8,auVar8);
          if (auVar7._0_4_ < 0.0) {
            local_88 = auVar8;
            fVar12 = sqrtf(auVar7._0_4_);
            fVar9 = local_88._0_4_;
          }
          else {
            auVar7 = vsqrtss_avx(auVar7,auVar7);
            fVar12 = auVar7._0_4_;
          }
          fVar9 = fVar9 / fVar12;
          local_98._0_4_ = 0.0;
          local_98._4_4_ = 0.0;
          local_90._0_4_ = 0.0;
          local_88._0_8_ = uVar6;
          p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_70 | uVar6);
          iVar5 = 0;
          do {
            FVar10 = Image::GetChannel(&this->image,p,iVar5,(WrapMode2D)0x200000002);
            auVar16 = auVar17._8_56_;
            pRVar4 = (RGB *)local_98;
            if ((iVar5 != 0) && (pRVar4 = (RGB *)(local_98 + 4), iVar5 != 1)) {
              pRVar4 = (RGB *)local_90;
            }
            pRVar4->r = FVar10;
            iVar5 = iVar5 + 1;
          } while (iVar5 != 3);
          auVar11 = extraout_var;
          RGBSpectrum::RGBSpectrum(&local_58,this->imageColorSpace,(RGB *)local_98);
          SVar18 = RGBSpectrum::Sample(&local_58,local_78);
          auVar15._0_8_ = SVar18.values.values._8_8_;
          auVar15._8_56_ = auVar16;
          auVar17._0_8_ = SVar18.values.values._0_8_;
          auVar17._8_56_ = auVar11;
          auVar7 = vmovlhps_avx(auVar17._0_16_,auVar15._0_16_);
          fVar9 = fVar9 * fVar9 * fVar9;
          auVar17 = ZEXT1664(CONCAT412(fVar9 * auVar7._12_4_ + fStack_5c,
                                       CONCAT48(fVar9 * auVar7._8_4_ + fStack_60,
                                                CONCAT44(fVar9 * auVar7._4_4_ +
                                                         (float)local_68._4_4_,
                                                         fVar9 * auVar7._0_4_ +
                                                         (float)local_68._0_4_))));
          uVar6 = local_88._0_8_ + 1;
          TVar3 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
        } while ((long)uVar6 < (long)TVar3.x);
      }
      auVar7 = auVar17._0_16_;
      local_b0 = local_b0 + 1;
      TVar3 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    } while (local_b0 < (long)TVar3 >> 0x20);
    iVar5 = TVar3.y;
  }
  fVar9 = this->scale * this->A;
  auVar14._0_4_ = (float)(TVar3.x * iVar5);
  auVar8._0_4_ = fVar9 * auVar7._0_4_;
  auVar8._4_4_ = fVar9 * auVar7._4_4_;
  auVar8._8_4_ = fVar9 * auVar7._8_4_;
  auVar8._12_4_ = fVar9 * auVar7._12_4_;
  auVar14._4_4_ = auVar14._0_4_;
  auVar14._8_4_ = auVar14._0_4_;
  auVar14._12_4_ = auVar14._0_4_;
  auVar7 = vdivps_avx(auVar8,auVar14);
  auVar8 = vshufpd_avx(auVar7,auVar7,1);
  SVar18.values.values._0_8_ = auVar7._0_8_;
  SVar18.values.values._8_8_ = auVar8._0_8_;
  return (SampledSpectrum)SVar18.values.values;
}

Assistant:

SampledSpectrum ProjectionLight::Phi(const SampledWavelengths &lambda) const {
    SampledSpectrum sum(0.f);
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u) {
            Point2f ps = screenBounds.Lerp(
                {(u + .5f) / image.Resolution().x, (v + .5f) / image.Resolution().y});
            Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));
            w = Normalize(w);
            Float dwdA = Pow<3>(w.z);

            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c);

            SampledSpectrum L = RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);

            sum += L * dwdA;
        }

    return scale * A * sum / (image.Resolution().x * image.Resolution().y);
}